

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_read_image.cxx
# Opt level: O1

void write_image_inside(Fl_RGB_Image *to,Fl_RGB_Image *from,int to_x,int to_y)

{
  bool bVar1;
  int iVar2;
  size_t __n;
  int iVar3;
  int iVar4;
  uchar *__dest;
  int iVar5;
  uchar *__src;
  
  iVar2 = (to->super_Fl_Image).ld_;
  if (iVar2 == 0) {
    iVar2 = (to->super_Fl_Image).d_ * (to->super_Fl_Image).w_;
  }
  iVar4 = (from->super_Fl_Image).ld_;
  if (iVar4 == 0) {
    iVar4 = (from->super_Fl_Image).d_ * (from->super_Fl_Image).w_;
  }
  iVar5 = (from->super_Fl_Image).h_;
  if (0 < iVar5) {
    __src = from->array + (iVar5 + -1) * iVar4;
    __dest = to->array + (long)to_x * (long)(to->super_Fl_Image).d_ + (long)(to_y * iVar2);
    do {
      iVar3 = (from->super_Fl_Image).d_;
      if (iVar3 == (to->super_Fl_Image).d_) {
        memcpy(__dest,__src,(long)(from->super_Fl_Image).w_ * (long)iVar3);
      }
      else if (0 < (from->super_Fl_Image).w_) {
        iVar3 = 0;
        do {
          __n = (size_t)(from->super_Fl_Image).d_;
          memcpy(__dest + (long)(to->super_Fl_Image).d_ * (long)iVar3,__src + __n * (long)iVar3,__n)
          ;
          iVar3 = iVar3 + 1;
        } while (iVar3 < (from->super_Fl_Image).w_);
      }
      __dest = __dest + iVar2;
      __src = __src + -(long)iVar4;
      bVar1 = 1 < iVar5;
      iVar5 = iVar5 + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

static void write_image_inside(Fl_RGB_Image *to, Fl_RGB_Image *from, int to_x, int to_y)
/* Copy the image "from" inside image "to" with its top-left angle at coordinates to_x, to_y.
 Also, exchange top and bottom of "from". Image depth can differ between "to" and "from".
 */
{
  int to_ld = (to->ld() == 0? to->w() * to->d() : to->ld());
  int from_ld = (from->ld() == 0? from->w() * from->d() : from->ld());
  uchar *tobytes = (uchar*)to->array + to_y * to_ld + to_x * to->d();
  const uchar *frombytes = from->array + (from->h() - 1) * from_ld;
  for (int i = from->h() - 1; i >= 0; i--) {
    if (from->d() == to->d()) memcpy(tobytes, frombytes, from->w() * from->d());
    else {
      for (int j = 0; j < from->w(); j++) {
        memcpy(tobytes + j * to->d(), frombytes + j * from->d(), from->d());
      }
    }
    tobytes += to_ld;
    frombytes -= from_ld;
  }
}